

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

void __thiscall cppcms::rpc::json_rpc_server::~json_rpc_server(json_rpc_server *this)

{
  _data *p_Var1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_application)._vptr_application = (_func_int **)&PTR__json_rpc_server_0028ca88;
  p_Var1 = (this->d).ptr_;
  if (p_Var1 != (_data *)0x0) {
    operator_delete(p_Var1);
  }
  pcVar2 = (this->smd_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->smd_).field_2) {
    operator_delete(pcVar2);
  }
  this_00 = (this->current_call_).
            super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
  ::~_Rb_tree(&(this->methods_)._M_t);
  application::~application(&this->super_application);
  return;
}

Assistant:

json_rpc_server::~json_rpc_server()
	{
	}